

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::
bindProcessName<Catch::ConfigData,std::__cxx11::string>
          (CommandLine<Catch::ConfigData> *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          field)

{
  IArgFunction<Catch::ConfigData> *pIVar1;
  undefined8 *puVar2;
  IArgFunction<Catch::ConfigData> *pIVar3;
  undefined **ppuVar4;
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR__IArgFunction_0016b690;
  puVar2[1] = field;
  pIVar3 = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  ppuVar4 = &PTR__IArgFunction_0016b690;
  pIVar3->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_0016b690;
  pIVar3[1]._vptr_IArgFunction = (_func_int **)field;
  pIVar1 = (this->m_boundProcessName).functionObj;
  if (pIVar1 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar1->_vptr_IArgFunction[1])();
    ppuVar4 = (undefined **)*puVar2;
  }
  (this->m_boundProcessName).functionObj = pIVar3;
  (*(code *)ppuVar4[1])(puVar2);
  return;
}

Assistant:

void bindProcessName( M C::* field ) {
            m_boundProcessName = new Detail::BoundDataMember<C,M>( field );
        }